

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O1

void __thiscall cnn::ComputationGraph::set_dim_for_new_node(ComputationGraph *this,VariableIndex *i)

{
  pointer pDVar1;
  Node *pNVar2;
  pointer pVVar3;
  Node *pNVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pVVar8;
  uint uVar9;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> xds;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> local_50;
  long local_34;
  undefined8 uStack_2c;
  undefined8 uStack_24;
  undefined8 uStack_1c;
  uint local_14;
  
  pNVar2 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start[i->t];
  std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::vector
            (&local_50,
             (ulong)((long)(pNVar2->args).
                           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    *(long *)&(pNVar2->args).
                              super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>
                              ._M_impl) >> 2 & 0xffffffff,(allocator_type *)&local_34);
  pVVar8 = *(pointer *)
            &(pNVar2->args).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl;
  pVVar3 = (pNVar2->args).
           super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar8 != pVVar3) {
    uVar9 = 0;
    do {
      pNVar4 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
               super__Vector_impl_data._M_start[pVVar8->t];
      local_50.super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>._M_impl.
      super__Vector_impl_data._M_start[uVar9].bd = (pNVar4->dim).bd;
      uVar5 = *(undefined8 *)((pNVar4->dim).d + 2);
      uVar6 = *(undefined8 *)((pNVar4->dim).d + 4);
      uVar7 = *(undefined8 *)((pNVar4->dim).d + 6);
      pDVar1 = local_50.super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9;
      *(undefined8 *)pDVar1->d = *(undefined8 *)(pNVar4->dim).d;
      *(undefined8 *)(pDVar1->d + 2) = uVar5;
      *(undefined8 *)(pDVar1->d + 4) = uVar6;
      *(undefined8 *)(pDVar1->d + 6) = uVar7;
      uVar9 = uVar9 + 1;
      pVVar8 = pVVar8 + 1;
    } while (pVVar8 != pVVar3);
  }
  (*pNVar2->_vptr_Node[2])(&local_34,pNVar2,&local_50);
  (pNVar2->dim).bd = local_14;
  *(long *)(pNVar2->dim).d = local_34;
  *(undefined8 *)((pNVar2->dim).d + 2) = uStack_2c;
  *(undefined8 *)((pNVar2->dim).d + 4) = uStack_24;
  *(undefined8 *)((pNVar2->dim).d + 6) = uStack_1c;
  if (local_50.super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ComputationGraph::set_dim_for_new_node(const VariableIndex& i) {
  Node* node = nodes[i];
  vector<Dim> xds(node->arity());
  unsigned ai = 0;
  for (VariableIndex arg : node->args) {
    xds[ai] = nodes[arg]->dim;
    ++ai;
  }
  node->dim = node->dim_forward(xds);
}